

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.h
# Opt level: O2

BasicStringView<const_char> __thiscall
Corrade::Containers::BasicStringView<const_char>::slice
          (BasicStringView<const_char> *this,size_t begin,size_t end)

{
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  BasicStringView<const_char> BVar4;
  size_t local_48;
  size_t local_40;
  anon_class_24_3_cb5dd4a3 local_38;
  
  local_38.end = &local_48;
  if (begin <= end) {
    uVar1 = this->_sizePlusFlags;
    sVar3 = uVar1 & 0x3fffffffffffffff;
    if (end <= sVar3) goto LAB_001144f4;
  }
  local_38.begin = &local_40;
  local_48 = end;
  local_40 = begin;
  local_38.this = this;
  slice::anon_class_24_3_cb5dd4a3::operator()(&local_38);
  uVar1 = this->_sizePlusFlags;
  sVar3 = uVar1 & 0x3fffffffffffffff;
  begin = local_40;
  end = local_48;
LAB_001144f4:
  BVar4._data = this->_data + begin;
  uVar2 = 0;
  if (end == sVar3) {
    uVar2 = uVar1 & 0x4000000000000000;
  }
  BVar4._sizePlusFlags = uVar2 | uVar1 & 0x8000000000000000 | end - begin;
  return BVar4;
}

Assistant:

constexpr BasicStringView<T> BasicStringView<T>::slice(const std::size_t begin, const std::size_t end) const {
    return CORRADE_CONSTEXPR_DEBUG_ASSERT(begin <= end && end <= (_sizePlusFlags & ~Implementation::StringViewSizeMask),
            "Containers::StringView::slice(): slice ["
            << Utility::Debug::nospace << begin
            << Utility::Debug::nospace << ":"
            << Utility::Debug::nospace << end
            << Utility::Debug::nospace << "] out of range for"
            << (_sizePlusFlags & ~Implementation::StringViewSizeMask) << "elements"),
        BasicStringView<T>{_data + begin, (end - begin)|
            /* Propagate the global flag always */
            (_sizePlusFlags & std::size_t(StringViewFlag::Global))|
            /* The null termination flag only if the original is
               null-terminated and end points to the original end */
            ((_sizePlusFlags & std::size_t(StringViewFlag::NullTerminated))*(end == (_sizePlusFlags & ~Implementation::StringViewSizeMask))),
            /* Using an internal assert-less constructor, the public
               constructor asserts would be redundant */
            nullptr};
}